

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O3

array<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_1UL>
 __thiscall inja::Renderer::get_arguments<1ul,0ul,true>(Renderer *this,FunctionNode *node)

{
  element_type *peVar1;
  _Map_pointer pppbVar2;
  _Type apbVar3;
  DataNode *node_00;
  pointer pcVar4;
  bool bVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer psVar9;
  _Elt_pointer ppbVar10;
  _Elt_pointer ppDVar11;
  long *plVar12;
  ulong *puVar13;
  ulong uVar14;
  _Elt_pointer ppbVar15;
  size_type *psVar16;
  char cVar17;
  ulong uVar18;
  string __str_1;
  string __str;
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  ulong *local_70;
  uint local_68;
  undefined4 uStack_64;
  ulong local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  psVar9 = (node->arguments).
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((node->arguments).
      super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == psVar9) {
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
    *(undefined1 *)local_50[0] = 0x31;
    plVar7 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1403f0);
    local_90 = &local_80;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_80 = *plVar12;
      lStack_78 = plVar7[3];
    }
    else {
      local_80 = *plVar12;
      local_90 = (long *)*plVar7;
    }
    local_88 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_90);
    puVar13 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar13) {
      local_a0 = *puVar13;
      lStack_98 = plVar7[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar13;
      local_b0 = (ulong *)*plVar7;
    }
    local_a8 = plVar7[1];
    *plVar7 = (long)puVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    uVar18 = (long)(node->arguments).
                   super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(node->arguments).
                   super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    cVar17 = '\x01';
    if (9 < uVar18) {
      uVar14 = uVar18;
      cVar6 = '\x04';
      do {
        cVar17 = cVar6;
        if (uVar14 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_0011de44;
        }
        if (uVar14 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_0011de44;
        }
        if (uVar14 < 10000) goto LAB_0011de44;
        bVar5 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar6 = cVar17 + '\x04';
      } while (bVar5);
      cVar17 = cVar17 + '\x01';
    }
LAB_0011de44:
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,uVar18);
    uVar18 = CONCAT44(uStack_64,local_68) + local_a8;
    uVar14 = 0xf;
    if (local_b0 != &local_a0) {
      uVar14 = local_a0;
    }
    if (uVar14 < uVar18) {
      uVar14 = 0xf;
      if (local_70 != local_60) {
        uVar14 = local_60[0];
      }
      if (uVar14 < uVar18) goto LAB_0011dead;
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_0011dead:
      puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar16 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_d0.field_2._M_allocated_capacity = *psVar16;
      local_d0.field_2._8_8_ = puVar8[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar16;
      local_d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_d0._M_string_length = puVar8[1];
    *puVar8 = psVar16;
    puVar8[1] = 0;
    *(undefined1 *)psVar16 = 0;
    throw_renderer_error(this,&local_d0,(AstNode *)node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    psVar9 = (node->arguments).
             super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  peVar1 = (psVar9->super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (**(peVar1->super_AstNode)._vptr_AstNode)(peVar1,this);
  pppbVar2 = (this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppbVar10 = (this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppbVar15 = (this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
  if (((long)(this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)ppbVar10 - (long)ppbVar15 >> 3) +
      ((((ulong)((long)pppbVar2 -
                (long)(this->data_eval_stack).c.
                      super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppbVar2 == (_Map_pointer)0x0)) * 0x40 != 0) goto LAB_0011e2f2;
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
  *(undefined1 *)local_50[0] = 0x31;
  plVar7 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1403f0);
  local_90 = &local_80;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_80 = *plVar12;
    lStack_78 = plVar7[3];
  }
  else {
    local_80 = *plVar12;
    local_90 = (long *)*plVar7;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_90);
  puVar13 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar13) {
    local_a0 = *puVar13;
    lStack_98 = plVar7[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar13;
    local_b0 = (ulong *)*plVar7;
  }
  local_a8 = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  pppbVar2 = (this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uVar18 = ((long)(this->data_eval_stack).c.
                  super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(this->data_eval_stack).c.
                  super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)(this->data_eval_stack).c.
                  super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)(this->data_eval_stack).c.
                  super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)pppbVar2 -
                     (long)(this->data_eval_stack).c.
                           super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(pppbVar2 == (_Map_pointer)0x0)) * 0x40;
  cVar17 = '\x01';
  if (9 < uVar18) {
    uVar14 = uVar18;
    cVar6 = '\x04';
    do {
      cVar17 = cVar6;
      if (uVar14 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_0011e188;
      }
      if (uVar14 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_0011e188;
      }
      if (uVar14 < 10000) goto LAB_0011e188;
      bVar5 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar6 = cVar17 + '\x04';
    } while (bVar5);
    cVar17 = cVar17 + '\x01';
  }
LAB_0011e188:
  local_70 = local_60;
  ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,uVar18);
  uVar18 = CONCAT44(uStack_64,local_68) + local_a8;
  uVar14 = 0xf;
  if (local_b0 != &local_a0) {
    uVar14 = local_a0;
  }
  if (uVar14 < uVar18) {
    uVar14 = 0xf;
    if (local_70 != local_60) {
      uVar14 = local_60[0];
    }
    if (uVar14 < uVar18) goto LAB_0011e1f1;
    puVar8 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0011e1f1:
    puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar16 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_d0.field_2._M_allocated_capacity = *psVar16;
    local_d0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar16;
    local_d0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_d0._M_string_length = puVar8[1];
  *puVar8 = psVar16;
  puVar8[1] = 0;
  *(undefined1 *)psVar16 = 0;
  throw_renderer_error(this,&local_d0,(AstNode *)node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  ppbVar10 = (this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppbVar15 = (this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_0011e2f2:
  if (ppbVar10 == ppbVar15) {
    ppbVar10 = (this->data_eval_stack).c.
               super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  apbVar3[0] = ppbVar10[-1];
  std::
  deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
  ::pop_back(&(this->data_eval_stack).c);
  if (apbVar3[0] ==
      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
       *)0x0) {
    ppDVar11 = (this->not_found_stack).c.
               super__Deque_base<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppDVar11 ==
        (this->not_found_stack).c.
        super__Deque_base<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppDVar11 = (this->not_found_stack).c.
                 super__Deque_base<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    node_00 = ppDVar11[-1];
    std::deque<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>::pop_back
              (&(this->not_found_stack).c);
    pcVar4 = (node_00->name)._M_dataplus._M_p;
    local_90 = &local_80;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar4,pcVar4 + (node_00->name)._M_string_length);
    plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x140420);
    puVar13 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar13) {
      local_a0 = *puVar13;
      lStack_98 = plVar7[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar13;
      local_b0 = (ulong *)*plVar7;
    }
    local_a8 = plVar7[1];
    *plVar7 = (long)puVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_b0);
    psVar16 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_d0.field_2._M_allocated_capacity = *psVar16;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar16;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar16;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    throw_renderer_error(this,&local_d0,(AstNode *)node_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
  }
  return (array<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_1UL>
          )(_Type)apbVar3[0];
}

Assistant:

std::array<const json*, N> get_arguments(const FunctionNode& node) {
    if (node.arguments.size() < N_start + N) {
      throw_renderer_error("function needs " + std::to_string(N_start + N) + " variables, but has only found " + std::to_string(node.arguments.size()), node);
    }

    for (size_t i = N_start; i < N_start + N; i += 1) {
      node.arguments[i]->accept(*this);
    }

    if (data_eval_stack.size() < N) {
      throw_renderer_error("function needs " + std::to_string(N) + " variables, but has only found " + std::to_string(data_eval_stack.size()), node);
    }

    std::array<const json*, N> result;
    for (size_t i = 0; i < N; i += 1) {
      result[N - i - 1] = data_eval_stack.top();
      data_eval_stack.pop();

      if (!result[N - i - 1]) {
        const auto data_node = not_found_stack.top();
        not_found_stack.pop();

        if (throw_not_found) {
          throw_renderer_error("variable '" + static_cast<std::string>(data_node->name) + "' not found", *data_node);
        }
      }
    }
    return result;
  }